

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbnf.cpp
# Opt level: O0

void __thiscall
icu_63::RuleBasedNumberFormat::setContext
          (RuleBasedNumberFormat *this,UDisplayContext value,UErrorCode *status)

{
  UBool UVar1;
  BreakIterator *pBVar2;
  UErrorCode *status_local;
  UDisplayContext value_local;
  RuleBasedNumberFormat *this_local;
  
  NumberFormat::setContext(&this->super_NumberFormat,value,status);
  UVar1 = ::U_SUCCESS(*status);
  if (UVar1 != '\0') {
    if ((this->capitalizationInfoSet == '\0') &&
       ((value == UDISPCTX_CAPITALIZATION_FOR_UI_LIST_OR_MENU ||
        (value == UDISPCTX_CAPITALIZATION_FOR_STANDALONE)))) {
      initCapitalizationContextInfo(this,&this->locale);
      this->capitalizationInfoSet = '\x01';
    }
    if ((this->capitalizationBrkIter == (BreakIterator *)0x0) &&
       (((value == UDISPCTX_CAPITALIZATION_FOR_BEGINNING_OF_SENTENCE ||
         ((value == UDISPCTX_CAPITALIZATION_FOR_UI_LIST_OR_MENU &&
          (this->capitalizationForUIListMenu != '\0')))) ||
        ((value == UDISPCTX_CAPITALIZATION_FOR_STANDALONE &&
         (this->capitalizationForStandAlone != '\0')))))) {
      *status = U_ZERO_ERROR;
      pBVar2 = BreakIterator::createSentenceInstance(&this->locale,status);
      this->capitalizationBrkIter = pBVar2;
      UVar1 = ::U_FAILURE(*status);
      if (UVar1 != '\0') {
        if (this->capitalizationBrkIter != (BreakIterator *)0x0) {
          (*(this->capitalizationBrkIter->super_UObject)._vptr_UObject[1])();
        }
        this->capitalizationBrkIter = (BreakIterator *)0x0;
      }
    }
  }
  return;
}

Assistant:

void
RuleBasedNumberFormat::setContext(UDisplayContext value, UErrorCode& status)
{
    NumberFormat::setContext(value, status);
    if (U_SUCCESS(status)) {
    	if (!capitalizationInfoSet &&
    	        (value==UDISPCTX_CAPITALIZATION_FOR_UI_LIST_OR_MENU || value==UDISPCTX_CAPITALIZATION_FOR_STANDALONE)) {
    	    initCapitalizationContextInfo(locale);
    	    capitalizationInfoSet = TRUE;
        }
#if !UCONFIG_NO_BREAK_ITERATION
        if ( capitalizationBrkIter == NULL && (value==UDISPCTX_CAPITALIZATION_FOR_BEGINNING_OF_SENTENCE ||
                (value==UDISPCTX_CAPITALIZATION_FOR_UI_LIST_OR_MENU && capitalizationForUIListMenu) ||
                (value==UDISPCTX_CAPITALIZATION_FOR_STANDALONE && capitalizationForStandAlone)) ) {
            status = U_ZERO_ERROR;
            capitalizationBrkIter = BreakIterator::createSentenceInstance(locale, status);
            if (U_FAILURE(status)) {
                delete capitalizationBrkIter;
                capitalizationBrkIter = NULL;
            }
        }
#endif
    }
}